

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall
basisu::basisu_frontend::create_optimized_selector_codebook(basisu_frontend *this,uint32_t iter)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  uint32_t uVar4;
  vector<unsigned_int> *pvVar5;
  etc_block *peVar6;
  ulong uVar7;
  uint *puVar8;
  uint32_t i;
  int iVar9;
  ulong uVar10;
  uint32_t y;
  uint32_t uVar11;
  size_t i_00;
  uint32_t x;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 extraout_XMM0_00 [16];
  image selector_cluster_vis;
  interval_timer tm;
  char buf [256];
  
  debug_printf("create_optimized_selector_codebook\n");
  interval_timer::interval_timer(&tm);
  interval_timer::start(&tm);
  uVar13 = (this->m_selector_cluster_block_indices).m_size;
  debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n",
               (ulong)uVar13);
  vector<basisu::etc_block>::resize(&this->m_optimized_cluster_selectors,(ulong)uVar13,false);
  uVar14 = 0;
  while (uVar14 < uVar13) {
    uVar1 = uVar14 + 0x100;
    buf._12_4_ = uVar1;
    if (uVar13 < uVar1) {
      buf._12_4_ = uVar13;
    }
    buf._24_8_ = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:2339:34)>
                 ::_M_invoke;
    buf._16_8_ = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:2339:34)>
                 ::_M_manager;
    buf._0_8_ = this;
    buf._8_4_ = uVar14;
    job_pool::add_job((this->m_params).m_pJob_pool,(function<void_()> *)buf);
    std::_Function_base::~_Function_base((_Function_base *)buf);
    uVar14 = uVar1;
  }
  job_pool::wait_for_all((this->m_params).m_pJob_pool);
  interval_timer::get_elapsed_secs(&tm);
  debug_printf("Elapsed time: %3.3f secs\n");
  if ((this->m_params).m_debug_images == true) {
    uVar13 = 0;
    for (uVar10 = 0; uVar14 = (this->m_selector_cluster_block_indices).m_size, uVar10 < uVar14;
        uVar10 = uVar10 + 1) {
      pvVar5 = vector<basisu::vector<unsigned_int>_>::operator[]
                         (&this->m_selector_cluster_block_indices,uVar10);
      if (uVar13 <= pvVar5->m_size) {
        uVar13 = pvVar5->m_size;
      }
    }
    if (uVar13 * 5 < 0x8000) {
      image::image(&selector_cluster_vis,uVar13 * 5 + 0x10,uVar14 * 5,0xffffffff);
      for (uVar10 = 0; uVar10 < (this->m_selector_cluster_block_indices).m_size; uVar10 = uVar10 + 1
          ) {
        pvVar5 = vector<basisu::vector<unsigned_int>_>::operator[]
                           (&this->m_selector_cluster_block_indices,uVar10);
        iVar3 = (int)uVar10 * 5;
        for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
          uVar12 = 0;
          iVar9 = 4;
          while (bVar15 = iVar9 != 0, iVar9 = iVar9 + -1, bVar15) {
            peVar6 = vector<basisu::etc_block>::operator[]
                               (&this->m_optimized_cluster_selectors,uVar10);
            uVar4 = etc_block::get_selector(peVar6,uVar12,uVar11);
            uVar7 = (ulong)(uVar4 * 0xff) / 3;
            if (0xfe < (uint)uVar7) {
              uVar7 = 0xff;
            }
            auVar16 = pmovsxbq(extraout_XMM0,0xffff);
            auVar17._8_8_ = auVar16._8_8_;
            auVar17._0_8_ = auVar16._0_8_ & 0xffffffffffffff00 | uVar7 & 0xff;
            auVar16 = pshufb(auVar17,_DAT_00264400);
            uVar2 = auVar16._0_4_;
            buf[0] = (char)uVar2;
            buf[1] = (char)((uint)uVar2 >> 8);
            buf[2] = (char)((uint)uVar2 >> 0x10);
            buf[3] = (char)((uint)uVar2 >> 0x18);
            image::set_clipped(&selector_cluster_vis,uVar12 | 4,iVar3 + uVar11,(color_rgba *)buf);
            uVar12 = uVar12 + 1;
          }
        }
        iVar9 = 0x10;
        for (i_00 = 0; i_00 < pvVar5->m_size; i_00 = i_00 + 1) {
          puVar8 = vector<unsigned_int>::operator[](pvVar5,i_00);
          peVar6 = vector<basisu::etc_block>::operator[]
                             (&this->m_orig_encoded_blocks,(ulong)*puVar8);
          for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
            for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
              uVar4 = etc_block::get_selector(peVar6,uVar12,uVar11);
              uVar7 = (ulong)(uVar4 * 0xff) / 3;
              if (0xfe < (uint)uVar7) {
                uVar7 = 0xff;
              }
              auVar16 = pmovsxbq(extraout_XMM0_00,0xffff);
              auVar16._0_8_ = auVar16._0_8_ & 0xffffffffffffff00 | uVar7 & 0xff;
              auVar16 = pshufb(auVar16,_DAT_00264400);
              uVar2 = auVar16._0_4_;
              buf[0] = (char)uVar2;
              buf[1] = (char)((uint)uVar2 >> 8);
              buf[2] = (char)((uint)uVar2 >> 0x10);
              buf[3] = (char)((uint)uVar2 >> 0x18);
              image::set_clipped(&selector_cluster_vis,uVar12 + iVar9,iVar3 + uVar11,
                                 (color_rgba *)buf);
            }
          }
          iVar9 = iVar9 + 5;
        }
      }
      snprintf(buf,0x100,"selector_cluster_vis_%u.png");
      save_png(buf,&selector_cluster_vis,0,0);
      free(selector_cluster_vis.m_pixels.m_p);
    }
  }
  return;
}

Assistant:

void basisu_frontend::create_optimized_selector_codebook(uint32_t iter)
	{
		debug_printf("create_optimized_selector_codebook\n");

		interval_timer tm;
		tm.start();

		const uint32_t total_selector_clusters = (uint32_t)m_selector_cluster_block_indices.size();

		debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n", (uint32_t)m_selector_cluster_block_indices.size());

		m_optimized_cluster_selectors.resize(total_selector_clusters);
		
		// For each selector codebook entry, and for each of the 4x4 selectors, determine which selector minimizes the error across all the blocks that use that quantized selector.
		const uint32_t N = 256;
		for (uint32_t cluster_index_iter = 0; cluster_index_iter < total_selector_clusters; cluster_index_iter += N)
		{
			const uint32_t first_index = cluster_index_iter;
			const uint32_t last_index = minimum<uint32_t>((uint32_t)total_selector_clusters, cluster_index_iter + N);

#ifndef __EMSCRIPTEN__			
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t cluster_index = first_index; cluster_index < last_index; cluster_index++)
				{
					const basisu::vector<uint32_t>& cluster_block_indices = m_selector_cluster_block_indices[cluster_index];

					if (!cluster_block_indices.size())
						continue;

					uint64_t total_err[4][4][4];
					clear_obj(total_err);

					for (uint32_t cluster_block_index = 0; cluster_block_index < cluster_block_indices.size(); cluster_block_index++)
					{
						const uint32_t block_index = cluster_block_indices[cluster_block_index];

						const etc_block& blk = m_encoded_blocks[block_index];

						color_rgba blk_colors[4];
						blk.get_block_colors(blk_colors, 0);

						for (uint32_t y = 0; y < 4; y++)
						{
							for (uint32_t x = 0; x < 4; x++)
							{
								const color_rgba& orig_color = get_source_pixel_block(block_index)(x, y);

								if (m_params.m_perceptual)
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(true, blk_colors[s], orig_color, false);
								}
								else
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(false, blk_colors[s], orig_color, false);
								}
							} // x
						} // y

					} // cluster_block_index

					for (uint32_t y = 0; y < 4; y++)
					{
						for (uint32_t x = 0; x < 4; x++)
						{
							uint64_t best_err = total_err[y][x][0];
							uint8_t best_sel = 0;

							for (uint32_t s = 1; s < 4; s++)
							{
								if (total_err[y][x][s] < best_err)
								{
									best_err = total_err[y][x][s];
									best_sel = (uint8_t)s;
								}
							}

							m_optimized_cluster_selectors[cluster_index].set_selector(x, y, best_sel);
						} // x
					} // y

				} // cluster_index

#ifndef __EMSCRIPTEN__
				});
#endif

		} // cluster_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
				
		if (m_params.m_debug_images)
		{
			uint32_t max_selector_cluster_size = 0;

			for (uint32_t i = 0; i < m_selector_cluster_block_indices.size(); i++)
				max_selector_cluster_size = maximum<uint32_t>(max_selector_cluster_size, (uint32_t)m_selector_cluster_block_indices[i].size());

			if ((max_selector_cluster_size * 5) < 32768)
			{
				const uint32_t x_spacer_len = 16;
				image selector_cluster_vis(x_spacer_len + max_selector_cluster_size * 5, (uint32_t)m_selector_cluster_block_indices.size() * 5);

				for (uint32_t selector_cluster_index = 0; selector_cluster_index < m_selector_cluster_block_indices.size(); selector_cluster_index++)
				{
					const basisu::vector<uint32_t> &cluster_block_indices = m_selector_cluster_block_indices[selector_cluster_index];

					for (uint32_t y = 0; y < 4; y++)
						for (uint32_t x = 0; x < 4; x++)
							selector_cluster_vis.set_clipped(x_spacer_len + x - 12, selector_cluster_index * 5 + y, color_rgba((m_optimized_cluster_selectors[selector_cluster_index].get_selector(x, y) * 255) / 3));

					for (uint32_t i = 0; i < cluster_block_indices.size(); i++)
					{
						uint32_t block_index = cluster_block_indices[i];

						const etc_block &blk = m_orig_encoded_blocks[block_index];
						
						for (uint32_t y = 0; y < 4; y++)
							for (uint32_t x = 0; x < 4; x++)
								selector_cluster_vis.set_clipped(x_spacer_len + x + 5 * i, selector_cluster_index * 5 + y, color_rgba((blk.get_selector(x, y) * 255) / 3));
					}
				}

				char buf[256];
				snprintf(buf, sizeof(buf), "selector_cluster_vis_%u.png", iter);
				save_png(buf, selector_cluster_vis);
			}
		}
	}